

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actorptrselect.cpp
# Opt level: O2

AActor * COPY_AAPTR(AActor *origin,int selector)

{
  ulong uVar1;
  AActor *pAVar2;
  uint uVar3;
  TObjPtr<AActor> *obj;
  undefined1 auStack_28 [8];
  FTranslatedLineTarget t;
  
  if (selector == 0) {
    return origin;
  }
  if (origin == (AActor *)0x0) {
LAB_004181d5:
    uVar3 = selector & 0x3fc1;
    if (uVar3 != 1) {
      if (uVar3 == 0x2000) {
        if (playeringame[7]) {
          return DAT_009bb680;
        }
      }
      else if (uVar3 == 0x80) {
        if (playeringame[1]) {
          return DAT_009ba6c0;
        }
      }
      else if (uVar3 == 0x100) {
        if (playeringame[2]) {
          return DAT_009ba960;
        }
      }
      else if (uVar3 == 0x200) {
        if (playeringame[3]) {
          return DAT_009bac00;
        }
      }
      else if (uVar3 == 0x400) {
        if (playeringame[4]) {
          return DAT_009baea0;
        }
      }
      else if (uVar3 == 0x800) {
        if (playeringame[5]) {
          return DAT_009bb140;
        }
      }
      else if (uVar3 == 0x1000) {
        if (playeringame[6]) {
          return DAT_009bb3e0;
        }
      }
      else {
        if (uVar3 != 0x40) {
          return origin;
        }
        if (playeringame[0]) {
          return players;
        }
      }
    }
LAB_004183b9:
    pAVar2 = (AActor *)0x0;
  }
  else {
    if (origin->player == (player_t *)0x0) {
LAB_00418194:
      uVar3 = selector & 0xc00e;
      if (uVar3 == 4) {
        obj = &origin->master;
      }
      else if (uVar3 == 8) {
        obj = &origin->tracer;
      }
      else {
        if (uVar3 == 0x4000) {
          if ((origin->FriendPlayer != 0) &&
             (uVar1 = (ulong)(origin->FriendPlayer - 1), playeringame[uVar1] == true)) {
            return (&players)[uVar1 * 0x54];
          }
          goto LAB_004183b9;
        }
        if (uVar3 != 2) goto LAB_004181d5;
        obj = &origin->target;
      }
    }
    else {
      if ((selector & 0x30U) != 0x20) {
        if ((selector & 0x30U) == 0x10) {
          P_BulletSlope((AActor *)auStack_28,(FTranslatedLineTarget *)origin,(int)&t);
          return t.linetarget;
        }
        goto LAB_00418194;
      }
      obj = &origin->player->ConversationNPC;
    }
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
  }
  return pAVar2;
}

Assistant:

AActor *COPY_AAPTR(AActor *origin, int selector)
{
	if (selector == AAPTR_DEFAULT) return origin;

	FTranslatedLineTarget t;

	if (origin)
	{
		if (origin->player)
		{
			switch (selector & AAPTR_PLAYER_SELECTORS)
			{
			case AAPTR_PLAYER_GETTARGET:
				P_BulletSlope(origin, &t, ALF_PORTALRESTRICT);
				return t.linetarget;

			case AAPTR_PLAYER_GETCONVERSATION:
				return origin->player->ConversationNPC;
			}
		}

		switch (selector & AAPTR_GENERAL_SELECTORS)
		{
		case AAPTR_TARGET: return origin->target;
		case AAPTR_MASTER: return origin->master;
		case AAPTR_TRACER: return origin->tracer;
		case AAPTR_FRIENDPLAYER:
			return origin->FriendPlayer ? AAPTR_RESOLVE_PLAYERNUM(origin->FriendPlayer - 1) : NULL;

		case AAPTR_GET_LINETARGET:
			P_BulletSlope(origin, &t, ALF_PORTALRESTRICT);
			return t.linetarget;
		}
	}

	switch (selector & AAPTR_STATIC_SELECTORS)
	{
		case AAPTR_PLAYER1: return AAPTR_RESOLVE_PLAYERNUM(0);
		case AAPTR_PLAYER2: return AAPTR_RESOLVE_PLAYERNUM(1);
		case AAPTR_PLAYER3: return AAPTR_RESOLVE_PLAYERNUM(2);
		case AAPTR_PLAYER4: return AAPTR_RESOLVE_PLAYERNUM(3);
		case AAPTR_PLAYER5: return AAPTR_RESOLVE_PLAYERNUM(4);
		case AAPTR_PLAYER6: return AAPTR_RESOLVE_PLAYERNUM(5);
		case AAPTR_PLAYER7: return AAPTR_RESOLVE_PLAYERNUM(6);
		case AAPTR_PLAYER8: return AAPTR_RESOLVE_PLAYERNUM(7);
		case AAPTR_NULL: return NULL;
	}

	return origin;
}